

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_0::CWriter::Write(CWriter *this,ExternalRef *name)

{
  size_type sVar1;
  string local_a0;
  string_view local_80;
  string local_70;
  string local_50;
  string_view local_30;
  undefined1 local_19;
  ExternalRef *pEStack_18;
  bool is_import;
  ExternalRef *name_local;
  CWriter *this_local;
  
  pEStack_18 = name;
  name_local = (ExternalRef *)this;
  sVar1 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count(&this->import_syms_,name->name);
  local_19 = sVar1 != 0;
  if ((bool)local_19) {
    GetGlobalName(&local_70,this,pEStack_18->name);
    Deref(&local_50,&local_70);
    string_view::string_view(&local_30,&local_50);
    Write(this,local_30);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
  }
  else {
    GetGlobalName(&local_a0,this,pEStack_18->name);
    string_view::string_view(&local_80,&local_a0);
    Write(this,local_80);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  return;
}

Assistant:

void CWriter::Write(const ExternalRef& name) {
  bool is_import = import_syms_.count(name.name) != 0;
  if (is_import) {
    Write(Deref(GetGlobalName(name.name)));
  } else {
    Write(GetGlobalName(name.name));
  }
}